

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPublicKey.cpp
# Opt level: O0

void __thiscall OSSLRSAPublicKey::setFromOSSL(OSSLRSAPublicKey *this,RSA *inRSA)

{
  undefined8 in_RSI;
  long *in_RDI;
  ByteString inE;
  ByteString inN;
  BIGNUM *bn_e;
  BIGNUM *bn_n;
  undefined1 local_80 [40];
  BIGNUM *in_stack_ffffffffffffffa8;
  undefined1 local_48 [40];
  long local_20;
  long local_18 [3];
  
  local_18[0] = 0;
  local_20 = 0;
  RSA_get0_key(in_RSI,local_18,&local_20,0);
  if (local_18[0] != 0) {
    OSSL::bn2ByteString(in_stack_ffffffffffffffa8);
    (**(code **)(*in_RDI + 0x30))(in_RDI,local_48);
    ByteString::~ByteString((ByteString *)0x1c3798);
  }
  if (local_20 != 0) {
    OSSL::bn2ByteString(in_stack_ffffffffffffffa8);
    (**(code **)(*in_RDI + 0x38))(in_RDI,local_80);
    ByteString::~ByteString((ByteString *)0x1c37ed);
  }
  return;
}

Assistant:

void OSSLRSAPublicKey::setFromOSSL(const RSA* inRSA)
{
	const BIGNUM* bn_n = NULL;
	const BIGNUM* bn_e = NULL;

	RSA_get0_key(inRSA, &bn_n, &bn_e, NULL);

	if (bn_n)
	{
		ByteString inN = OSSL::bn2ByteString(bn_n);
		setN(inN);
	}
	if (bn_e)
	{
		ByteString inE = OSSL::bn2ByteString(bn_e);
		setE(inE);
	}
}